

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec.cc
# Opt level: O2

int pkey_ec_init(EVP_PKEY_CTX *ctx)

{
  void *pvVar1;
  
  pvVar1 = OPENSSL_zalloc(0x10);
  if (pvVar1 != (void *)0x0) {
    ctx->data = pvVar1;
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

static int pkey_ec_init(EVP_PKEY_CTX *ctx) {
  EC_PKEY_CTX *dctx =
      reinterpret_cast<EC_PKEY_CTX *>(OPENSSL_zalloc(sizeof(EC_PKEY_CTX)));
  if (!dctx) {
    return 0;
  }

  ctx->data = dctx;
  return 1;
}